

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

UINT8 __thiscall S98Player::GetSongInfo(S98Player *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  size_type sVar2;
  UINT32 local_2c;
  PLR_SONG_INFO *songInf_local;
  S98Player *this_local;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    songInf->format = 0x53393800;
    songInf->fileVerMaj = (ushort)(this->_fileHdr).fileVer;
    songInf->fileVerMin = 0;
    songInf->tickRateMul = (this->_fileHdr).tickMult;
    songInf->tickRateDiv = (this->_fileHdr).tickDiv;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if ((this->_fileHdr).loopOfs == 0) {
      local_2c = 0xffffffff;
    }
    else {
      local_2c = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])();
    }
    songInf->loopTick = local_2c;
    songInf->volGain = 0x10000;
    sVar2 = std::vector<S98_DEVICE,_std::allocator<S98_DEVICE>_>::size(&this->_devHdrs);
    songInf->deviceCnt = (UINT32)sVar2;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 S98Player::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_S98;
	songInf.fileVerMaj = _fileHdr.fileVer;
	songInf.fileVerMin = 0x00;
	songInf.tickRateMul = _fileHdr.tickMult;
	songInf.tickRateDiv = _fileHdr.tickDiv;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _fileHdr.loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devHdrs.size();
	
	return 0x00;
}